

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

string * __thiscall
testing::internal::FormatFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  string file_name;
  int local_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this == (internal *)0x0) {
    this = (internal *)"unknown file";
  }
  local_b4 = (int)file;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,(char *)this,(allocator<char> *)&local_90);
  if ((int)file < 0) {
    std::operator+(__return_storage_ptr__,&local_b0,":");
  }
  else {
    std::operator+(&local_50,&local_b0,":");
    StreamableToString<int>(&local_70,&local_b4);
    std::operator+(&local_90,&local_50,&local_70);
    std::operator+(__return_storage_ptr__,&local_90,":");
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatFileLocation(const char* file, int line) {
  const std::string file_name(file == nullptr ? kUnknownFile : file);

  if (line < 0) {
    return file_name + ":";
  }
#ifdef _MSC_VER
  return file_name + "(" + StreamableToString(line) + "):";
#else
  return file_name + ":" + StreamableToString(line) + ":";
#endif  // _MSC_VER
}